

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  ImVec4 *pIVar1;
  undefined8 *puVar2;
  int *piVar3;
  int iVar4;
  ImDrawChannel *pIVar5;
  void *pvVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  long lVar9;
  ImDrawChannel *__dest;
  long lVar10;
  void *pvVar11;
  long lVar12;
  void *__dest_00;
  long lVar13;
  char *__function;
  int iVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  
  if ((this->_Current != 0) || (1 < this->_Count)) {
    __assert_fail("_Current == 0 && _Count <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_draw.cpp"
                  ,0x4e9,"void ImDrawListSplitter::Split(ImDrawList *, int)");
  }
  iVar4 = (this->_Channels).Size;
  if (iVar4 < channels_count) {
    iVar16 = (this->_Channels).Capacity;
    if (iVar16 < channels_count) {
      if (iVar16 == 0) {
        iVar14 = 8;
      }
      else {
        iVar14 = iVar16 / 2 + iVar16;
      }
      if (iVar14 <= channels_count) {
        iVar14 = channels_count;
      }
      if (iVar16 < iVar14) {
        __dest = (ImDrawChannel *)ImGui::MemAlloc((long)iVar14 << 5);
        pIVar5 = (this->_Channels).Data;
        if (pIVar5 != (ImDrawChannel *)0x0) {
          memcpy(__dest,pIVar5,(long)(this->_Channels).Size << 5);
          ImGui::MemFree((this->_Channels).Data);
        }
        (this->_Channels).Data = __dest;
        (this->_Channels).Capacity = iVar14;
      }
    }
    (this->_Channels).Size = channels_count;
  }
  this->_Count = channels_count;
  if ((this->_Channels).Size < 1) {
LAB_001f393b:
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                  ,0x503,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
  }
  pIVar5 = (this->_Channels).Data;
  (pIVar5->_IdxBuffer).Size = 0;
  (pIVar5->_IdxBuffer).Capacity = 0;
  (pIVar5->_IdxBuffer).Data = (unsigned_short *)0x0;
  (pIVar5->_CmdBuffer).Size = 0;
  (pIVar5->_CmdBuffer).Capacity = 0;
  (pIVar5->_CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    uVar18 = 1;
    lVar17 = 0x38;
    do {
      lVar10 = (long)(this->_Channels).Size;
      if ((long)uVar18 < (long)iVar4) {
        if (lVar10 <= (long)uVar18) goto LAB_001f393b;
        pIVar5 = (this->_Channels).Data;
        iVar16 = *(int *)((long)pIVar5 + lVar17 + -0x14);
        if (iVar16 < 0) {
          uVar15 = iVar16 / 2 + iVar16;
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          pvVar11 = ImGui::MemAlloc((ulong)uVar15 * 0x38);
          pvVar6 = *(void **)((long)pIVar5 + lVar17 + -0x10);
          if (pvVar6 != (void *)0x0) {
            memcpy(pvVar11,pvVar6,(long)*(int *)((long)pIVar5 + lVar17 + -0x18) * 0x38);
            ImGui::MemFree(*(void **)((long)pIVar5 + lVar17 + -0x10));
          }
          *(void **)((long)pIVar5 + lVar17 + -0x10) = pvVar11;
          *(uint *)((long)pIVar5 + lVar17 + -0x14) = uVar15;
        }
        *(undefined4 *)((long)pIVar5 + lVar17 + -0x18) = 0;
        if ((long)(this->_Channels).Size <= (long)uVar18) goto LAB_001f393b;
        pIVar5 = (this->_Channels).Data;
        iVar16 = *(int *)((long)pIVar5 + lVar17 + -4);
        if (iVar16 < 0) {
          iVar16 = iVar16 / 2 + iVar16;
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          pvVar11 = ImGui::MemAlloc((ulong)(uint)(iVar16 * 2));
          pvVar6 = *(void **)((long)&(pIVar5->_CmdBuffer).Size + lVar17);
          if (pvVar6 != (void *)0x0) {
            memcpy(pvVar11,pvVar6,(long)*(int *)((long)pIVar5 + lVar17 + -8) * 2);
            ImGui::MemFree(*(void **)((long)&(pIVar5->_CmdBuffer).Size + lVar17));
          }
          *(void **)((long)&(pIVar5->_CmdBuffer).Size + lVar17) = pvVar11;
          *(int *)((long)pIVar5 + lVar17 + -4) = iVar16;
        }
        *(undefined4 *)((long)pIVar5 + lVar17 + -8) = 0;
      }
      else {
        if (lVar10 <= (long)uVar18) goto LAB_001f393b;
        pIVar5 = (this->_Channels).Data;
        puVar2 = (undefined8 *)((long)pIVar5 + lVar17 + -8);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)pIVar5 + lVar17 + -0x18);
        *puVar2 = 0;
        puVar2[1] = 0;
      }
      if ((long)(this->_Channels).Size <= (long)uVar18) goto LAB_001f393b;
      pIVar5 = (this->_Channels).Data;
      if (*(int *)((long)pIVar5 + lVar17 + -0x18) == 0) {
        lVar10 = (long)(draw_list->_ClipRectStack).Size;
        if (lVar10 < 1) {
          __function = "T &ImVector<ImVec4>::back() [T = ImVec4]";
LAB_001f3986:
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                        ,0x50d,__function);
        }
        pIVar1 = (draw_list->_ClipRectStack).Data + lVar10 + -1;
        lVar10._0_4_ = pIVar1->x;
        lVar10._4_4_ = pIVar1->y;
        uVar7 = pIVar1->z;
        uVar8 = pIVar1->w;
        lVar12 = (long)(draw_list->_TextureIdStack).Size;
        if (lVar12 < 1) {
          __function = "T &ImVector<void *>::back() [T = void *]";
          goto LAB_001f3986;
        }
        pvVar6 = (draw_list->_TextureIdStack).Data[lVar12 + -1];
        if (*(int *)((long)pIVar5 + lVar17 + -0x14) == 0) {
          __dest_00 = ImGui::MemAlloc(0x1c0);
          pvVar11 = *(void **)((long)pIVar5 + lVar17 + -0x10);
          if (pvVar11 != (void *)0x0) {
            memcpy(__dest_00,pvVar11,(long)*(int *)((long)pIVar5 + lVar17 + -0x18) * 0x38);
            ImGui::MemFree(*(void **)((long)pIVar5 + lVar17 + -0x10));
          }
          *(void **)((long)pIVar5 + lVar17 + -0x10) = __dest_00;
          *(undefined4 *)((long)pIVar5 + lVar17 + -0x14) = 8;
        }
        lVar12 = *(long *)((long)pIVar5 + lVar17 + -0x10);
        lVar13 = (long)*(int *)((long)pIVar5 + lVar17 + -0x18) * 0x38;
        *(ulong *)(lVar12 + 0x10 + lVar13) = CONCAT44(uStack_34,uVar8);
        lVar9 = CONCAT44(uVar7,lVar10._4_4_);
        *(long *)(lVar12 + lVar13) = lVar10 << 0x20;
        ((long *)(lVar12 + lVar13))[1] = lVar9;
        *(void **)(lVar12 + 0x18 + lVar13) = pvVar6;
        puVar2 = (undefined8 *)(lVar12 + 0x20 + lVar13);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined8 *)(lVar12 + 0x30 + lVar13) = 0;
        piVar3 = (int *)((long)pIVar5 + lVar17 + -0x18);
        *piVar3 = *piVar3 + 1;
      }
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + 0x20;
    } while ((uint)channels_count != uVar18);
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = draw_list->_ClipRectStack.back();
            draw_cmd.TextureId = draw_list->_TextureIdStack.back();
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}